

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O2

uc_afl_ret
uc_afl_fuzz(uc_engine *uc,char *input_file,uc_afl_cb_place_input_t place_input_callback,
           uint64_t *exits,size_t exit_count,uc_afl_cb_validate_crash_t validate_crash_callback,
           bool always_validate,uint32_t persistent_iters,void *data)

{
  double __x;
  uc_afl_ret uVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  UCAFL ucafl;
  
  log_init();
  __x = log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if ((((uc == (uc_engine *)0x0) || (input_file == (char *)0x0)) || (*input_file == '\0')) ||
     (((place_input_callback == (uc_afl_cb_place_input_t)0x0 ||
       (always_validate && validate_crash_callback == (uc_afl_cb_validate_crash_t)0x0)) ||
      (exit_count == 0)))) {
    log(__x);
    uVar1 = UC_AFL_RET_ERROR;
  }
  else {
    ucafl.fuzz_callback_ = dummy_uc_afl_fuzz_callback;
    ucafl.always_validate_ = always_validate;
    ucafl.persistent_iters_ = persistent_iters;
    ucafl.data_ = data;
    ucafl.afl_area_ptr_ = (uint8_t *)0x0;
    ucafl.has_afl_ = false;
    ucafl.afl_prev_loc_ = 0;
    ucafl.afl_testcase_ptr_ = (uint32_t *)0x0;
    ucafl.afl_testcase_len_p_ = (uint32_t *)0x0;
    ucafl.afl_child_pipe_[0] = 0;
    ucafl.afl_child_pipe_[1] = 0;
    ucafl.afl_parent_pipe_[0] = 0;
    ucafl.afl_parent_pipe_[1] = 0;
    ucafl.h1_ = 0;
    ucafl.h2_ = 0;
    ucafl.h3_ = 0;
    ucafl.h4_ = 0;
    ucafl.uc_ = uc;
    ucafl.input_file_ = input_file;
    ucafl.place_input_callback_ = place_input_callback;
    ucafl.validate_crash_callback_ = validate_crash_callback;
    uVar1 = UCAFL::set_exits(&ucafl,exits,exit_count);
    if (uVar1 == UC_AFL_RET_OK) {
      uVar1 = UCAFL::fsrv_run(&ucafl);
    }
    else {
      uVar1 = UC_AFL_RET_ERROR;
    }
    UCAFL::~UCAFL(&ucafl);
  }
  return uVar1;
}

Assistant:

UNICORNAFL_EXPORT uc_afl_ret uc_afl_fuzz(
    uc_engine* uc, char* input_file,
    uc_afl_cb_place_input_t place_input_callback, uint64_t* exits,
    size_t exit_count, uc_afl_cb_validate_crash_t validate_crash_callback,
    bool always_validate, uint32_t persistent_iters, void* data) {

    log_init();

    ERR("Entering uc_afl_fuzz with input_file=%s and persistent_iters=%" PRIu32
        "\n",
        input_file, persistent_iters);
    // Sanity Check.
    if (!uc) {
        ERR("Unicorn Engine passed to uc_afl_fuzz is NULL!\n");
        return UC_AFL_RET_ERROR;
    }
    if (!input_file || input_file[0] == 0) {
        ERR("No input file provided to uc_afl_fuzz.\n");
        return UC_AFL_RET_ERROR;
    }
    if (!place_input_callback) {
        ERR("no place_input_callback set.\n");
        return UC_AFL_RET_ERROR;
    }
    if (always_validate && !validate_crash_callback) {
        ERR("always_validate set but validate_crash_callback is missing.\n");
        return UC_AFL_RET_ERROR;
    }
    if (!exit_count) {
        ERR("Nullptr provided for exits.\n");
        return UC_AFL_RET_ERROR;
    }

    UCAFL ucafl(uc, input_file, place_input_callback, validate_crash_callback,
                dummy_uc_afl_fuzz_callback, always_validate, persistent_iters,
                data);

    if (unlikely(ucafl.set_exits(exits, exit_count))) {
        return UC_AFL_RET_ERROR;
    }

    return ucafl.fsrv_run();
}